

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_disasm.cpp
# Opt level: O2

bool __thiscall
DisasmReplayer::enqueue_create_raytracing_pipeline
          (DisasmReplayer *this,Hash hash,VkRayTracingPipelineCreateInfoKHR *create_info,
          VkPipeline *pipeline)

{
  bool bVar1;
  VkResult VVar2;
  VkRayTracingPipelineCreateInfoKHR *create_info_local;
  Hash hash_local;
  
  create_info_local = create_info;
  hash_local = hash;
  bVar1 = raytracing_pipeline_is_active(this,hash);
  if (bVar1) {
    if (this->device == (VulkanDevice *)0x0) {
      *pipeline = (VkPipeline)hash;
    }
    else {
      if (this->device->pipeline_stats == true) {
        *(byte *)&create_info->flags = (byte)create_info->flags | 0xc0;
      }
      fprintf(_stderr,"Fossilize INFO: Creating raytracing pipeline %0lX\n",hash);
      fflush(_stderr);
      VVar2 = (*vkCreateRayTracingPipelinesKHR)
                        (this->device->device,(VkDeferredOperationKHR)0x0,this->pipeline_cache,1,
                         create_info,(VkAllocationCallbacks *)0x0,pipeline);
      if (VVar2 != VK_SUCCESS) {
        fwrite("Fossilize ERROR:  ... Failed!\n",0x1e,1,_stderr);
        fflush(_stderr);
        return false;
      }
      fwrite("Fossilize INFO:  ... Succeeded!\n",0x20,1,_stderr);
      fflush(_stderr);
    }
    std::vector<VkPipeline_T_*,_std::allocator<VkPipeline_T_*>_>::push_back
              (&this->raytracing_pipelines,pipeline);
    std::
    vector<const_VkRayTracingPipelineCreateInfoKHR_*,_std::allocator<const_VkRayTracingPipelineCreateInfoKHR_*>_>
    ::push_back(&this->raytracing_infos,&create_info_local);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&this->raytracing_hashes,&hash_local);
  }
  else {
    *pipeline = (VkPipeline)hash;
  }
  return true;
}

Assistant:

bool enqueue_create_raytracing_pipeline(Hash hash, const VkRayTracingPipelineCreateInfoKHR *create_info, VkPipeline *pipeline) override
	{
		if (!raytracing_pipeline_is_active(hash))
		{
			*pipeline = fake_handle<VkPipeline>(hash);
			return true;
		}

		if (device)
		{
			if (device->has_pipeline_stats())
			{
				const_cast<VkRayTracingPipelineCreateInfoKHR *>(create_info)->flags |=
						VK_PIPELINE_CREATE_CAPTURE_STATISTICS_BIT_KHR | VK_PIPELINE_CREATE_CAPTURE_INTERNAL_REPRESENTATIONS_BIT_KHR;
			}

			LOGI("Creating raytracing pipeline %0" PRIX64 "\n", hash);
			if (vkCreateRayTracingPipelinesKHR(device->get_device(), VK_NULL_HANDLE, pipeline_cache,
			                                   1, create_info, nullptr, pipeline) != VK_SUCCESS)
			{
				LOGE(" ... Failed!\n");
				return false;
			}
			LOGI(" ... Succeeded!\n");
		}
		else
			*pipeline = fake_handle<VkPipeline>(hash);

		raytracing_pipelines.push_back(*pipeline);
		raytracing_infos.push_back(create_info);
		raytracing_hashes.push_back(hash);
		return true;
	}